

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFilter.cpp
# Opt level: O1

bool __thiscall TestFilter::match(TestFilter *this,SimpleString *name)

{
  bool bVar1;
  
  if (this->strictMatching_ == true) {
    bVar1 = ::operator==(name,&this->filter_);
  }
  else {
    bVar1 = SimpleString::contains(name,&this->filter_);
  }
  return (bool)(bVar1 ^ this->invertMatching_);
}

Assistant:

bool TestFilter::match(const SimpleString& name) const
{
    bool matches = false;

    if(strictMatching_)
        matches = name == filter_;
    else
        matches = name.contains(filter_);

    return invertMatching_ ? !matches : matches;
}